

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QChar>::emplace_back_impl<QChar_const&>
          (QVLABase<QChar> *this,qsizetype prealloc,void *array,QChar *args)

{
  reference pvVar1;
  long lVar2;
  
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar2 = (this->super_QVLABaseBase).s;
  }
  pvVar1 = (reference)((long)(this->super_QVLABaseBase).ptr + lVar2 * 2);
  pvVar1->ucs = args->ucs;
  (this->super_QVLABaseBase).s = lVar2 + 1;
  return pvVar1;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }